

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5.c
# Opt level: O3

void proxy_socks5_process_queue(ProxyNegotiator *pn)

{
  Interactor **data_00;
  BinarySink *pBVar1;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var2;
  long lVar3;
  BinarySink *pBVar4;
  Interactor *pIVar5;
  ptrlen password;
  ptrlen pl;
  SeatPromptResult spr_00;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  prompts_t *ppVar9;
  InteractionReadySeat IVar10;
  size_t sVar11;
  strbuf *buf_o;
  long lVar12;
  char *pcVar13;
  undefined8 uVar14;
  size_t len_00;
  ulong uVar15;
  char *fmt;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen challenge;
  uchar len;
  uchar data_3 [2];
  uchar data_2 [2];
  uchar data_4 [2];
  uchar data_1 [2];
  uchar data [4];
  SeatPromptResult spr;
  char hostname [512];
  byte local_255;
  byte local_254;
  byte local_253;
  byte local_252;
  byte local_251;
  byte local_250;
  char local_24f;
  byte local_24e;
  byte local_24d;
  byte local_24c;
  byte local_24b;
  char local_249;
  SeatPromptResult local_248;
  char local_228 [520];
  
  iVar8 = *(int *)&pn[-4].output[0].ch;
  if (0x154 < iVar8) {
    if (iVar8 < 0x1bd) {
      if (iVar8 == 0x155) goto LAB_0013c28d;
      if (iVar8 == 0x159) {
        uVar7 = *(uint *)((long)&pn[-4].output[0].binarysink_[0].binarysink_ + 4);
        goto LAB_0013c2c4;
      }
      if (iVar8 != 0x1ad) goto LAB_0013c256;
      *(undefined4 *)&pn[-4].output[0].ch = 0x1bd;
LAB_0013bbb7:
      _Var6 = bufchain_try_fetch_consume(pn->input,&local_24c,4);
      if (!_Var6) {
        return;
      }
      local_24e = local_24c;
      if (local_24c != 5) goto LAB_0013bdab;
      uVar15 = (ulong)local_24b;
      if (local_24b != 0) {
        if (local_24b < 9) {
          pcVar13 = &DAT_00171968 +
                    *(int *)("address type not supported" + (long)(char)local_24b * 4 + 0x18);
        }
        else {
          pcVar13 = "unknown";
        }
        fmt = "SOCKS proxy failed to connect, error %d (%s)";
        goto LAB_0013be3e;
      }
      if (local_249 == '\x01') {
        iVar8 = 4;
      }
      else {
        if (local_249 == '\x03') {
          *(undefined4 *)&pn[-4].output[0].ch = 0x1da;
          goto LAB_0013bec3;
        }
        if (local_249 != '\x04') {
          pcVar13 = dupprintf("SOCKS proxy response included unknown address type %d");
          goto LAB_0013c252;
        }
        iVar8 = 0x10;
      }
      pn[-1].aborted = (_Bool)(char)iVar8;
      pn[-1].reconnect = (_Bool)(char)((uint)iVar8 >> 8);
      *(short *)&pn[-1].field_0x52 = (short)((uint)iVar8 >> 0x10);
      *(undefined4 *)&pn[-4].output[0].ch = 0x1e5;
    }
    else {
      if (iVar8 == 0x1bd) goto LAB_0013bbb7;
      if (iVar8 == 0x1da) {
LAB_0013bec3:
        _Var6 = bufchain_try_fetch_consume(pn->input,&local_255,1);
        if (!_Var6) {
          return;
        }
        uVar7 = (uint)local_255;
        pn[-1].aborted = (_Bool)(char)uVar7;
        pn[-1].reconnect = (_Bool)(char)(uVar7 >> 8);
        *(short *)&pn[-1].field_0x52 = (short)(uVar7 >> 0x10);
        goto LAB_0013c256;
      }
      if (iVar8 != 0x1e5) goto LAB_0013c256;
      iVar8._0_1_ = pn[-1].aborted;
      iVar8._1_1_ = pn[-1].reconnect;
      iVar8._2_2_ = *(undefined2 *)&pn[-1].field_0x52;
    }
    _Var6 = bufchain_try_consume(pn->input,(long)(iVar8 + 2));
    if (!_Var6) {
      return;
    }
    pn->done = true;
    goto LAB_0013c256;
  }
  if (iVar8 < 0xca) {
    if (iVar8 == 0) {
      pBVar4 = pn->output[0].binarysink_;
      BinarySink_put_byte(pBVar4,'\x05');
      strbuf_shrink_to((strbuf *)pn[-4].output[0].binarysink_[0].write,0);
      BinarySink_put_byte((BinarySink *)(pn[-4].output[0].binarysink_[0].write + 0x18),'\0');
      pBVar1 = pn[-1].output[0].binarysink_[0].binarysink_;
      pcVar13 = conf_get_str(pn->ps->conf,0x10);
      sVar11 = strlen(pcVar13);
      pl_00.len = sVar11;
      pl_00.ptr = pcVar13;
      BinarySink_put_datapl(pBVar1 + 1,pl_00);
      pIVar5 = pn[-1].itr;
      pcVar13 = conf_get_str(pn->ps->conf,0x11);
      sVar11 = strlen(pcVar13);
      pl_01.len = sVar11;
      pl_01.ptr = pcVar13;
      BinarySink_put_datapl((BinarySink *)(pIVar5 + 1),pl_01);
      if ((pn->itr != (Interactor *)0x0) ||
         (((pn[-1].output[0].binarysink_[0].binarysink_)->binarysink_ != (BinarySink *)0x0 &&
          ((pn[-1].itr)->last_to_talk != (Interactor *)0x0)))) {
        BinarySink_put_byte((BinarySink *)(pn[-4].output[0].binarysink_[0].write + 0x18),'\x03');
        BinarySink_put_byte((BinarySink *)(pn[-4].output[0].binarysink_[0].write + 0x18),'\x02');
      }
      BinarySink_put_byte(pBVar4,(uchar)pn[-4].output[0].binarysink_[0].write[0x10]);
      BinarySink_put_datapl(pBVar4,*(ptrlen *)(pn[-4].output[0].binarysink_[0].write + 8));
      *(undefined4 *)&pn[-4].output[0].ch = 0x77;
      return;
    }
    if (iVar8 == 0x77) {
      *(undefined4 *)&pn[-4].output[0].ch = 0x81;
    }
    else if (iVar8 != 0x81) goto LAB_0013c256;
    _Var6 = bufchain_try_fetch_consume(pn->input,&local_24e,2);
    if (!_Var6) {
      return;
    }
    if (local_24e == 5) {
      uVar15 = (ulong)local_24d;
      if (local_24d == 0xff) {
        pcVar13 = "SOCKS server rejected every authentication method we offered";
        goto LAB_0013c1f5;
      }
      p_Var2 = pn[-4].output[0].binarysink_[0].write;
      lVar3 = *(long *)(p_Var2 + 0x10);
      if (lVar3 != 0) {
        lVar12 = 0;
        do {
          if (*(byte *)(*(long *)(p_Var2 + 8) + lVar12) == local_24d) {
            *(byte *)&pn[-4].output[0].binarysink_[0].writefmtv = local_24d;
            if (local_24d == 0) goto LAB_0013c387;
            if ((pn->itr == (Interactor *)0x0) ||
               (((pn[-1].output[0].binarysink_[0].binarysink_)->binarysink_ != (BinarySink *)0x0 &&
                ((pn[-1].itr)->last_to_talk != (Interactor *)0x0)))) goto LAB_0013c040;
            ppVar9 = proxy_new_prompts(pn->ps);
            *(prompts_t **)&pn[-1].done = ppVar9;
            ppVar9->to_server = true;
            ppVar9->from_server = false;
            pcVar13 = dupstr("SOCKS proxy authentication");
            ppVar9 = *(prompts_t **)&pn[-1].done;
            ppVar9->name = pcVar13;
            if ((pn[-1].output[0].binarysink_[0].binarysink_)->binarysink_ == (BinarySink *)0x0) {
              *(int *)&pn[-1].error = (int)ppVar9->n_prompts;
              pcVar13 = dupstr("Proxy username: ");
              add_prompt(ppVar9,pcVar13,true);
            }
            else {
              *(undefined4 *)&pn[-1].error = 0xffffffff;
            }
            if ((pn[-1].itr)->last_to_talk == (Interactor *)0x0) {
              ppVar9 = *(prompts_t **)&pn[-1].done;
              *(int *)((long)&pn[-1].error + 4) = (int)ppVar9->n_prompts;
              pcVar13 = dupstr("Proxy password: ");
              add_prompt(ppVar9,pcVar13,false);
            }
            else {
              *(undefined4 *)((long)&pn[-1].error + 4) = 0xffffffff;
            }
            goto LAB_0013bf70;
          }
          lVar12 = lVar12 + 1;
        } while (lVar3 != lVar12);
      }
      if (local_24d < 4) {
        pcVar13 = &DAT_00171988 + *(int *)(&DAT_00171988 + uVar15 * 4);
      }
      else {
        pcVar13 = "unknown";
      }
      fmt = "SOCKS server asked for auth method %d (%s), which we did not offer";
LAB_0013be3e:
      pcVar13 = dupprintf(fmt,uVar15,pcVar13);
    }
    else {
LAB_0013bdab:
      pcVar13 = "SOCKS proxy returned unexpected reply version %d (expected %d)";
      uVar14 = 5;
      local_250 = local_24e;
LAB_0013c201:
      pcVar13 = dupprintf(pcVar13,(ulong)local_250,uVar14);
    }
  }
  else {
    if (iVar8 != 0xca) {
      if (iVar8 != 0x100) {
        if (iVar8 == 0x13f) goto LAB_0013c214;
        goto LAB_0013c256;
      }
LAB_0013c0a0:
      _Var6 = bufchain_try_fetch_consume(pn->input,&local_250,2);
      if (!_Var6) {
        return;
      }
      if (local_250 == 1) {
        if (local_24f == '\0') {
LAB_0013c387:
          pBVar4 = pn->output[0].binarysink_;
          BinarySink_put_byte(pBVar4,'\x05');
          BinarySink_put_byte(pBVar4,'\x01');
          BinarySink_put_byte(pBVar4,'\0');
          iVar8 = sk_addrtype(pn->ps->remote_addr);
          if (iVar8 != 4) {
            if (iVar8 == 2) {
              BinarySink_put_byte(pBVar4,'\x04');
              sk_addrcopy(pn->ps->remote_addr,local_228);
              len_00 = 0x10;
            }
            else {
              if (iVar8 != 1) {
                __assert_fail("false && \"Unexpected addrtype in SOCKS 5 proxy\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/socks5.c"
                              ,0x1a9,"void proxy_socks5_process_queue(ProxyNegotiator *)");
              }
              BinarySink_put_byte(pBVar4,'\x01');
              sk_addrcopy(pn->ps->remote_addr,local_228);
              len_00 = 4;
            }
            BinarySink_put_data(pBVar4,local_228,len_00);
LAB_0013c42e:
            BinarySink_put_uint16(pBVar4,(long)pn->ps->remote_port);
            *(undefined4 *)&pn[-4].output[0].ch = 0x1ad;
            return;
          }
          BinarySink_put_byte(pBVar4,'\x03');
          sk_getaddr(pn->ps->remote_addr,local_228,0x200);
          _Var6 = BinarySink_put_pstring(pBVar4,local_228);
          if (_Var6) goto LAB_0013c42e;
          pcVar13 = "SOCKS 5 cannot support host names longer than 255 chars";
        }
        else {
          pcVar13 = "SOCKS 5 server rejected our password";
        }
        goto LAB_0013c1f5;
      }
      pcVar13 = "SOCKS 5 password reply had version number %d (expected %d)";
LAB_0013c1fc:
      uVar14 = 1;
      goto LAB_0013c201;
    }
LAB_0013bf70:
    IVar10 = interactor_announce(pn->itr);
    (*(IVar10.seat)->vt->get_userpass_input)(&local_248,IVar10.seat,*(prompts_t **)&pn[-1].done);
    if (local_248.kind != SPRK_OK) {
      if (1 < local_248.kind - SPRK_USER_ABORT) {
        *(undefined4 *)&pn[-4].output[0].ch = 0xca;
        return;
      }
      spr_00._4_4_ = local_248._4_4_;
      spr_00.kind = local_248.kind;
      spr_00.errfn = local_248.errfn;
      spr_00.errdata_lit = local_248.errdata_lit;
      spr_00.errdata_u = local_248.errdata_u;
      spr_00._28_4_ = local_248._28_4_;
      proxy_spr_abort(pn,spr_00);
      goto LAB_0013c256;
    }
    if (*(int *)&pn[-1].error != -1) {
      strbuf_shrink_to((strbuf *)pn[-1].output[0].binarysink_[0].binarysink_,0);
      pBVar4 = pn[-1].output[0].binarysink_[0].binarysink_;
      pcVar13 = prompt_get_result_ref
                          (*(prompt_t **)
                            (*(long *)(*(long *)&pn[-1].done + 0x38) +
                            (long)*(int *)&pn[-1].error * 8));
      sVar11 = strlen(pcVar13);
      pl_02.len = sVar11;
      pl_02.ptr = pcVar13;
      BinarySink_put_datapl(pBVar4 + 1,pl_02);
    }
    if (*(int *)((long)&pn[-1].error + 4) != -1) {
      strbuf_shrink_to((strbuf *)pn[-1].itr,0);
      pIVar5 = pn[-1].itr;
      pcVar13 = prompt_get_result_ref
                          (*(prompt_t **)
                            (*(long *)(*(long *)&pn[-1].done + 0x38) +
                            (long)*(int *)((long)&pn[-1].error + 4) * 8));
      sVar11 = strlen(pcVar13);
      pl_03.len = sVar11;
      pl_03.ptr = pcVar13;
      BinarySink_put_datapl((BinarySink *)(pIVar5 + 1),pl_03);
    }
    free_prompts(*(prompts_t **)&pn[-1].done);
    *(undefined8 *)&pn[-1].done = 0;
    local_24d = *(byte *)&pn[-4].output[0].binarysink_[0].writefmtv;
LAB_0013c040:
    if (local_24d == 3) {
      pBVar4 = pn->output[0].binarysink_;
      BinarySink_put_byte(pBVar4,'\x01');
      BinarySink_put_byte(pBVar4,'\x02');
      BinarySink_put_byte(pBVar4,'\x11');
      BinarySink_put_byte(pBVar4,'\x01');
      BinarySink_put_byte(pBVar4,0x85);
      BinarySink_put_byte(pBVar4,'\x02');
      _Var6 = BinarySink_put_pstring
                        (pBVar4,(char *)(pn[-1].output[0].binarysink_[0].binarysink_)->write);
      if (!_Var6) {
        pcVar13 = "SOCKS 5 CHAP authentication cannot support usernames longer than 255 chars";
        goto LAB_0013c1f5;
      }
      while( true ) {
        *(undefined4 *)&pn[-4].output[0].ch = 0x13f;
LAB_0013c214:
        _Var6 = bufchain_try_fetch_consume(pn->input,&local_252,2);
        if (!_Var6) {
          return;
        }
        if (local_252 != 1) {
          pcVar13 = "SOCKS 5 CHAP reply had version number %d (expected %d)";
          local_250 = local_252;
          goto LAB_0013c1fc;
        }
        uVar7 = (uint)local_251;
        *(uint *)((long)&pn[-4].output[0].binarysink_[0].writefmtv + 4) = (uint)local_251;
        if (local_251 == 0) break;
        while (*(uint *)((long)&pn[-4].output[0].binarysink_[0].writefmtv + 4) = uVar7 - 1,
              uVar7 != 0) {
          *(undefined4 *)&pn[-4].output[0].ch = 0x155;
LAB_0013c28d:
          _Var6 = bufchain_try_fetch_consume(pn->input,&local_254,2);
          if (!_Var6) {
            return;
          }
          *(uint *)&pn[-4].output[0].binarysink_[0].binarysink_ = (uint)local_254;
          uVar7 = (uint)local_253;
          *(uint *)((long)&pn[-4].output[0].binarysink_[0].binarysink_ + 4) = uVar7;
          *(undefined4 *)&pn[-4].output[0].ch = 0x159;
LAB_0013c2c4:
          data_00 = &pn[-4].itr;
          _Var6 = bufchain_try_fetch_consume(pn->input,data_00,(ulong)uVar7);
          if (!_Var6) {
            return;
          }
          iVar8 = *(int *)&pn[-4].output[0].binarysink_[0].binarysink_;
          if (iVar8 == 3) {
            password.ptr = (pn[-1].itr)->parent;
            password.len = (size_t)(pn[-1].itr)->last_to_talk;
            challenge.len._0_4_ =
                 *(undefined4 *)((long)&pn[-4].output[0].binarysink_[0].binarysink_ + 4);
            challenge.ptr = data_00;
            challenge.len._4_4_ = 0;
            buf_o = chap_response(challenge,password);
            pBVar4 = pn->output[0].binarysink_;
            BinarySink_put_byte(pBVar4,'\x01');
            BinarySink_put_byte(pBVar4,'\x01');
            BinarySink_put_byte(pBVar4,'\x04');
            BinarySink_put_byte(pBVar4,(uchar)buf_o->len);
            pl.ptr = buf_o->u;
            pl.len = buf_o->len;
            BinarySink_put_datapl(pBVar4,pl);
            strbuf_free(buf_o);
          }
          else if (iVar8 == 0) {
            if ((*(int *)((long)&pn[-4].output[0].binarysink_[0].binarysink_ + 4) == 1) &&
               (*(char *)data_00 == '\0')) goto LAB_0013c387;
            pcVar13 = "SOCKS 5 CHAP authentication failed";
            goto LAB_0013c1f5;
          }
          uVar7 = *(uint *)((long)&pn[-4].output[0].binarysink_[0].writefmtv + 4);
        }
      }
      pcVar13 = dupprintf("SOCKS 5 CHAP reply sent no attributes");
    }
    else {
      if (local_24d != 2) {
        __assert_fail("false && \"bad auth method in SOCKS 5 negotiation\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/socks5.c"
                      ,0x177,"void proxy_socks5_process_queue(ProxyNegotiator *)");
      }
      pBVar4 = pn->output[0].binarysink_;
      BinarySink_put_byte(pBVar4,'\x01');
      _Var6 = BinarySink_put_pstring
                        (pBVar4,(char *)(pn[-1].output[0].binarysink_[0].binarysink_)->write);
      if (_Var6) {
        _Var6 = BinarySink_put_pstring(pBVar4,(char *)(pn[-1].itr)->vt);
        if (_Var6) {
          *(undefined4 *)&pn[-4].output[0].ch = 0x100;
          goto LAB_0013c0a0;
        }
        pcVar13 = "SOCKS 5 authentication cannot support passwords longer than 255 chars";
      }
      else {
        pcVar13 = "SOCKS 5 authentication cannot support usernames longer than 255 chars";
      }
LAB_0013c1f5:
      pcVar13 = dupstr(pcVar13);
    }
  }
LAB_0013c252:
  pn->error = pcVar13;
LAB_0013c256:
  *(undefined4 *)&pn[-4].output[0].ch = 0;
  return;
}

Assistant:

static void proxy_socks5_process_queue(ProxyNegotiator *pn)
{
    Socks5ProxyNegotiator *s = container_of(pn, Socks5ProxyNegotiator, pn);

    crBegin(s->crLine);

    /*
     * SOCKS 5 initial client packet:
     *
     *   byte      version
     *   byte      number of available auth methods
     *   byte[]    that many bytes indicating auth types
     */

    put_byte(pn->output, SOCKS5_REQUEST_VERSION);

    strbuf_clear(s->auth_methods_offered);

    /*
     * We have two basic kinds of authentication to offer: none at
     * all, and password-based systems (whether the password is sent
     * in cleartext or proved via CHAP).
     *
     * We always offer 'none' as an option. We offer 'password' if we
     * either have a username and password already from the Conf, or
     * we have a Seat available to ask for them interactively. If
     * neither, we don't offer those options in the first place.
     */
    put_byte(s->auth_methods_offered, SOCKS5_AUTH_NONE);

    put_dataz(s->username, conf_get_str(pn->ps->conf, CONF_proxy_username));
    put_dataz(s->password, conf_get_str(pn->ps->conf, CONF_proxy_password));
    if (pn->itr || (s->username->len && s->password->len)) {
        if (socks5_chap_available)
            put_byte(s->auth_methods_offered, SOCKS5_AUTH_CHAP);

        put_byte(s->auth_methods_offered, SOCKS5_AUTH_PASSWORD);
    }

    put_byte(pn->output, s->auth_methods_offered->len);
    put_datapl(pn->output, ptrlen_from_strbuf(s->auth_methods_offered));

    crReturnV;

    /*
     * SOCKS 5 initial server packet:
     *
     *   byte      version
     *   byte      selected auth method, or SOCKS5_AUTH_REJECTED
     */
    {
        unsigned char data[2];
        crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, data, 2));

        if (data[0] != SOCKS5_REPLY_VERSION) {
            pn->error = dupprintf("SOCKS proxy returned unexpected "
                                  "reply version %d (expected %d)",
                                  (int)data[0], SOCKS5_REPLY_VERSION);
            crStopV;
        }

        if (data[1] == SOCKS5_AUTH_REJECTED) {
            pn->error = dupstr("SOCKS server rejected every authentication "
                               "method we offered");
            crStopV;
        }

        {
            bool found = false;
            for (size_t i = 0; i < s->auth_methods_offered->len; i++)
                if (s->auth_methods_offered->u[i] == data[1]) {
                    found = true;
                    break;
                }

            if (!found) {
                pn->error = dupprintf("SOCKS server asked for auth method %d "
                                      "(%s), which we did not offer",
                                      (int)data[1], socks5_auth_name(data[1]));
                crStopV;
            }
        }

        s->auth_method = data[1];
    }

    /*
     * The 'none' auth option requires no further negotiation. If that
     * was the one we selected, go straight to making the connection.
     */
    if (s->auth_method == SOCKS5_AUTH_NONE)
        goto authenticated;

    /*
     * Otherwise, we're going to need a username and password, so this
     * is the moment to stop and ask for one if we don't already have
     * them.
     */
    if (pn->itr && (!s->username->len || !s->password->len)) {
        s->prompts = proxy_new_prompts(pn->ps);
        s->prompts->to_server = true;
        s->prompts->from_server = false;
        s->prompts->name = dupstr("SOCKS proxy authentication");
        if (!s->username->len) {
            s->username_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy username: "), true);
        } else {
            s->username_prompt_index = -1;
        }
        if (!s->password->len) {
            s->password_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy password: "), false);
        } else {
            s->password_prompt_index = -1;
        }

        while (true) {
            SeatPromptResult spr = seat_get_userpass_input(
                interactor_announce(pn->itr), s->prompts);
            if (spr.kind == SPRK_OK) {
                break;
            } else if (spr_is_abort(spr)) {
                proxy_spr_abort(pn, spr);
                crStopV;
            }
            crReturnV;
        }

        if (s->username_prompt_index != -1) {
            strbuf_clear(s->username);
            put_dataz(s->username,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->username_prompt_index]));
        }

        if (s->password_prompt_index != -1) {
            strbuf_clear(s->password);
            put_dataz(s->password,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->password_prompt_index]));
        }

        free_prompts(s->prompts);
        s->prompts = NULL;
    }

    /*
     * Now process the different auth methods that will use that
     * username and password. Note we can't do this using the natural
     * idiom of a switch statement, because there are crReturns inside
     * some cases.
     */
    if (s->auth_method == SOCKS5_AUTH_PASSWORD) {
        /*
         * SOCKS 5 password auth packet:
         *
         *   byte      version
         *   pstring   username
         *   pstring   password
         */
        put_byte(pn->output, SOCKS5_AUTH_PASSWORD_VERSION);
        if (!put_pstring(pn->output, s->username->s)) {
            pn->error = dupstr("SOCKS 5 authentication cannot support "
                               "usernames longer than 255 chars");
            crStopV;
        }
        if (!put_pstring(pn->output, s->password->s)) {
            pn->error = dupstr("SOCKS 5 authentication cannot support "
                               "passwords longer than 255 chars");
            crStopV;
        }

        /*
         * SOCKS 5 password reply packet:
         *
         *   byte      version
         *   byte      0 for success, >0 for failure
         */
        unsigned char data[2];
        crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, data, 2));

        if (data[0] != SOCKS5_AUTH_PASSWORD_VERSION) {
            pn->error = dupprintf(
                "SOCKS 5 password reply had version number %d (expected "
                "%d)", (int)data[0], SOCKS5_AUTH_PASSWORD_VERSION);
            crStopV;
        }

        if (data[1] != 0) {
            pn->error = dupstr("SOCKS 5 server rejected our password");
            crStopV;
        }
    } else if (s->auth_method == SOCKS5_AUTH_CHAP) {
        assert(socks5_chap_available);

        /*
         * All CHAP packets, in both directions, have the same
         * overall format:
         *
         *   byte      version
         *   byte      number of attributes
         *
         * and then for each attribute:
         *
         *   byte      attribute type
         *   byte      length
         *   byte[]    that many bytes of payload
         *
         * In the initial outgoing packet we send two attributes:
         * the list of supported algorithm names, and the
         * username.
         *
         * (It's possible that we ought to delay sending the
         * username until the second packet, in case the proxy
         * sent back an attribute indicating which character set
         * it would like us to use.)
         */
        put_byte(pn->output, SOCKS5_AUTH_CHAP_VERSION);
        put_byte(pn->output, 2);   /* number of attributes */

        put_byte(pn->output, SOCKS5_AUTH_CHAP_ATTR_ALGLIST);
        put_byte(pn->output, 1);   /* string length */
        put_byte(pn->output, SOCKS5_AUTH_CHAP_ALG_HMACMD5);

        /* Second attribute: username */
        {
            put_byte(pn->output, SOCKS5_AUTH_CHAP_ATTR_USERNAME);
            if (!put_pstring(pn->output, s->username->s)) {
                pn->error = dupstr(
                    "SOCKS 5 CHAP authentication cannot support "
                    "usernames longer than 255 chars");
                crStopV;
            }
        }

        while (true) {
            /*
             * Process a CHAP response packet, which has the same
             * overall format as the outgoing packet shown above.
             */
            unsigned char data[2];
            crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                  pn->input, data, 2));
            if (data[0] != SOCKS5_AUTH_CHAP_VERSION) {
                pn->error = dupprintf(
                    "SOCKS 5 CHAP reply had version number %d (expected "
                    "%d)", (int)data[0], SOCKS5_AUTH_CHAP_VERSION);
                crStopV;
            }

            s->n_chap_attrs = data[1];
            if (s->n_chap_attrs == 0) {
                /*
                 * If we receive a CHAP packet containing no
                 * attributes, then we have nothing we didn't have
                 * before, and can't make further progress.
                 */
                pn->error = dupprintf(
                    "SOCKS 5 CHAP reply sent no attributes");
                crStopV;
            }
            while (s->n_chap_attrs-- > 0) {
                unsigned char data[2];
                crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                      pn->input, data, 2));
                s->chap_attr = data[0];
                s->chap_attr_len = data[1];
                crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                      pn->input, s->chap_buf, s->chap_attr_len));

                if (s->chap_attr == SOCKS5_AUTH_CHAP_ATTR_STATUS) {
                    if (s->chap_attr_len == 1 && s->chap_buf[0] == 0) {
                        /* Status 0 means success: we are authenticated! */
                        goto authenticated;
                    } else {
                        pn->error = dupstr(
                            "SOCKS 5 CHAP authentication failed");
                        crStopV;
                    }
                } else if (s->chap_attr==SOCKS5_AUTH_CHAP_ATTR_CHALLENGE) {
                    /* The CHAP challenge string. Send the response */
                    strbuf *response = chap_response(
                        make_ptrlen(s->chap_buf, s->chap_attr_len),
                        ptrlen_from_strbuf(s->password));

                    put_byte(pn->output, SOCKS5_AUTH_CHAP_VERSION);
                    put_byte(pn->output, 1); /* number of attributes */
                    put_byte(pn->output, SOCKS5_AUTH_CHAP_ATTR_RESPONSE);
                    put_byte(pn->output, response->len);
                    put_datapl(pn->output, ptrlen_from_strbuf(response));

                    strbuf_free(response);
                } else {
                    /* ignore all other attributes */
                }
            }
        }
    } else {
        unreachable("bad auth method in SOCKS 5 negotiation");
    }

  authenticated:

    /*
     * SOCKS 5 connection command:
     *
     *   byte      version
     *   byte      command
     *   byte      reserved (send as zero)
     *   byte      address type
     *   byte[]    address, with variable size (see below)
     *   uint16    port
     */
    put_byte(pn->output, SOCKS5_REPLY_VERSION);
    put_byte(pn->output, SOCKS_CMD_CONNECT);
    put_byte(pn->output, 0);   /* reserved byte */

    switch (sk_addrtype(pn->ps->remote_addr)) {
      case ADDRTYPE_IPV4: {
        /* IPv4: address is 4 raw bytes */
        put_byte(pn->output, SOCKS5_ADDR_IPV4);
        char buf[4];
        sk_addrcopy(pn->ps->remote_addr, buf);
        put_data(pn->output, buf, sizeof(buf));
        break;
      }
      case ADDRTYPE_IPV6: {
        /* IPv6: address is 16 raw bytes */
        put_byte(pn->output, SOCKS5_ADDR_IPV6);
        char buf[16];
        sk_addrcopy(pn->ps->remote_addr, buf);
        put_data(pn->output, buf, sizeof(buf));
        break;
      }
      case ADDRTYPE_NAME: {
        /* Hostname: address is a pstring (Pascal-style string,
         * unterminated but with a one-byte prefix length) */
        put_byte(pn->output, SOCKS5_ADDR_HOSTNAME);
        char hostname[512];
        sk_getaddr(pn->ps->remote_addr, hostname, lenof(hostname));
        if (!put_pstring(pn->output, hostname)) {
            pn->error = dupstr(
                "SOCKS 5 cannot support host names longer than 255 chars");
            crStopV;
        }
        break;
      }
      default:
        unreachable("Unexpected addrtype in SOCKS 5 proxy");
    }

    put_uint16(pn->output, pn->ps->remote_port);
    crReturnV;

    /*
     * SOCKS 5 connection response:
     *
     *   byte      version
     *   byte      status
     *   byte      reserved
     *   byte      address type
     *   byte[]    address bound to (same formats as in connection request)
     *   uint16    port
     *
     * We read the first four bytes and then decide what to do next.
     */
    {
        unsigned char data[4];
        crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, data, 4));

        if (data[0] != SOCKS5_REPLY_VERSION) {
            pn->error = dupprintf("SOCKS proxy returned unexpected "
                                  "reply version %d (expected %d)",
                                  (int)data[0], SOCKS5_REPLY_VERSION);
            crStopV;
        }

        if (data[1] != SOCKS5_RESP_SUCCESS) {
            pn->error = dupprintf("SOCKS proxy failed to connect, error %d "
                                  "(%s)", (int)data[1],
                                  socks5_response_text(data[1]));
            crStopV;
        }

        /*
         * Process each address type to find out the size of the rest
         * of the packet. Note we can't do this using the natural
         * idiom of a switch statement, because there are crReturns
         * inside some cases.
         */
        if (data[3] == SOCKS5_ADDR_IPV4) {
            s->response_addr_length = 4;
        } else if (data[3] == SOCKS5_ADDR_IPV6) {
            s->response_addr_length = 16;
        } else if (data[3] == SOCKS5_ADDR_HOSTNAME) {
            /* Read the hostname length byte to find out how much to read */
            unsigned char len; 
            crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, &len, 1));
            s->response_addr_length = len;
            break;
        } else {
            pn->error = dupprintf("SOCKS proxy response included unknown "
                                  "address type %d", (int)data[3]);
            crStopV;
        }

        /* Read and ignore the address and port fields */
        crMaybeWaitUntilV(bufchain_try_consume(
                              pn->input, s->response_addr_length + 2));
    }

    /* And we're done! */
    pn->done = true;
    crFinishV;
}